

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

Signal<double,_int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getPtr(SignalPtr<double,_int> *this)

{
  uint uVar1;
  ExceptionSignal *this_00;
  undefined8 uVar2;
  allocator<char> local_39;
  string local_38 [36];
  ErrorCodeEnum local_14;
  SignalPtr<double,_int> *local_10;
  SignalPtr<double,_int> *this_local;
  
  local_10 = this;
  uVar1 = (*this->_vptr_SignalPtr[4])();
  if ((uVar1 & 1) == 0) {
    this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_14 = NOT_INITIALIZED;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"In SignalPtr: SIN ptr not set.",&local_39);
    SignalBase<int>::getName_abi_cxx11_
              ((SignalBase<int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
    uVar2 = std::__cxx11::string::c_str();
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (this_00,&local_14,local_38," (in signal <%s>)",uVar2);
    __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
  }
  return this->signalPtr;
}

Assistant:

const Signal<T, Time> *SignalPtr<T, Time>::getPtr() const {
  dgTDEBUGIN(25) << SignalBase<Time>::name << "(" << isPlugged() << ")" << this
                 << "->" << signalPtr << std::endl;
  dgTDEBUGIN(25);
  if (!isPlugged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  dgTDEBUGOUT(25);
  return signalPtr;
}